

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

char * cmsys::SystemTools::ReplaceChars(char *str,char *toreplace,char replacement)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  
  pcVar1 = str;
  if ((str != (char *)0x0) && (*str != '\0')) {
    do {
      cVar4 = *toreplace;
      if (cVar4 != '\0') {
        cVar3 = *str;
        pcVar2 = toreplace + 1;
        do {
          if (cVar3 == cVar4) {
            *str = replacement;
            cVar3 = replacement;
          }
          cVar4 = *pcVar2;
          pcVar2 = pcVar2 + 1;
        } while (cVar4 != '\0');
      }
      pcVar2 = str + 1;
      str = str + 1;
    } while (*pcVar2 != '\0');
  }
  return pcVar1;
}

Assistant:

char* SystemTools::ReplaceChars(char* str, const char* toreplace,
                                char replacement)
{
  if (str) {
    char* ptr = str;
    while (*ptr) {
      const char* ptr2 = toreplace;
      while (*ptr2) {
        if (*ptr == *ptr2) {
          *ptr = replacement;
        }
        ++ptr2;
      }
      ++ptr;
    }
  }
  return str;
}